

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spoa::Graph::InitializeMultipleSequenceAlignment
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Graph *this,
          uint32_t *row_size)

{
  value_type pNVar1;
  bool bVar2;
  size_type sVar3;
  const_reference ppNVar4;
  reference pvVar5;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *this_00;
  reference ppNVar6;
  Node **jt;
  iterator __end2;
  iterator __begin2;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range2;
  value_type it;
  value_type local_38;
  uint32_t i;
  uint32_t j;
  allocator<unsigned_int> local_22;
  undefined1 local_21;
  value_type *local_20;
  uint32_t *row_size_local;
  Graph *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *dst;
  
  local_21 = 0;
  local_20 = row_size;
  row_size_local = &this->num_codes_;
  this_local = (Graph *)__return_storage_ptr__;
  sVar3 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::size(&this->nodes_);
  std::allocator<unsigned_int>::allocator(&local_22);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,sVar3,&local_22);
  std::allocator<unsigned_int>::~allocator(&local_22);
  local_38 = 0;
  for (it._4_4_ = 0;
      sVar3 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                        (&this->rank_to_node_), it._4_4_ < sVar3; it._4_4_ = it._4_4_ + 1) {
    ppNVar4 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                        (&this->rank_to_node_,(ulong)it._4_4_);
    pNVar1 = *ppNVar4;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)pNVar1->id);
    *pvVar5 = local_38;
    this_00 = &pNVar1->aligned_nodes;
    __end2 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin(this_00);
    jt = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                            (this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                       *)&jt), bVar2) {
      ppNVar6 = __gnu_cxx::
                __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                ::operator*(&__end2);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(ulong)(*ppNVar6)->id);
      *pvVar5 = local_38;
      it._4_4_ = it._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
      ::operator++(&__end2);
    }
    local_38 = local_38 + 1;
  }
  if (local_20 != (value_type *)0x0) {
    *local_20 = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint32_t> Graph::InitializeMultipleSequenceAlignment(
    std::uint32_t* row_size) const {
  std::vector<std::uint32_t> dst(nodes_.size());
  std::uint32_t j = 0;
  for (std::uint32_t i = 0; i < rank_to_node_.size(); ++i, ++j) {
    auto it = rank_to_node_[i];
    dst[it->id] = j;
    for (const auto& jt : it->aligned_nodes) {
      dst[jt->id] = j;
      ++i;
    }
  }
  if (row_size) {
    *row_size = j;
  }
  return dst;
}